

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode output_auth_headers(connectdata *conn,auth *authstatus,char *request,char *path,_Bool proxy
                            )

{
  Curl_easy *data;
  unsigned_long uVar1;
  Curl_easy *data_00;
  CURLcode CVar2;
  long lVar3;
  size_t insize;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  char **ppcVar8;
  size_t size;
  char *local_48;
  long local_40;
  size_t local_38;
  
  data = conn->data;
  uVar1 = authstatus->picked;
  if (uVar1 == 1) {
    if (proxy) {
      if (((conn->bits).proxy_user_passwd == true) &&
         (pcVar4 = Curl_checkProxyheaders(conn,"Proxy-authorization:"), pcVar4 == (char *)0x0)) {
        local_40 = 0x438;
        lVar3 = 0x180;
        lVar5 = 0x188;
LAB_005601c0:
        local_38 = 0;
        local_48 = (char *)0x0;
        data_00 = conn->data;
        pcVar4 = curl_maprintf("%s:%s",*(undefined8 *)((conn->chunk).hexbuffer + lVar3 + -0x20),
                               *(undefined8 *)((conn->chunk).hexbuffer + lVar5 + -0x20));
        if (pcVar4 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        insize = strlen(pcVar4);
        CVar2 = Curl_base64_encode(data_00,pcVar4,insize,&local_48,&local_38);
        lVar3 = local_40;
        if (CVar2 != CURLE_OK) {
LAB_00560211:
          (*Curl_cfree)(pcVar4);
          return CVar2;
        }
        if (local_48 == (char *)0x0) {
          CVar2 = CURLE_REMOTE_ACCESS_DENIED;
          goto LAB_00560211;
        }
        (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + local_40 + -0x20));
        pcVar6 = "";
        if (proxy) {
          pcVar6 = "Proxy-";
        }
        pcVar6 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar6,local_48);
        *(char **)((conn->chunk).hexbuffer + lVar3 + -0x20) = pcVar6;
        (*Curl_cfree)(local_48);
        if (*(long *)((conn->chunk).hexbuffer + lVar3 + -0x20) == 0) {
          CVar2 = CURLE_OUT_OF_MEMORY;
          goto LAB_00560211;
        }
        (*Curl_cfree)(pcVar4);
        authstatus->done = true;
        pcVar4 = "Basic";
        goto LAB_00560146;
      }
    }
    else if (((conn->bits).user_passwd == true) &&
            (pcVar4 = Curl_checkheaders(conn,"Authorization:"), pcVar4 == (char *)0x0)) {
      local_40 = 0x450;
      lVar3 = 0x210;
      lVar5 = 0x218;
      goto LAB_005601c0;
    }
    authstatus->done = true;
LAB_00560136:
    authstatus->multipass = false;
  }
  else {
    if (uVar1 == 2) {
      CVar2 = Curl_output_digest(conn,proxy,(uchar *)request,(uchar *)path);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      pcVar4 = "Digest";
    }
    else {
      if (uVar1 != 8) goto LAB_00560136;
      CVar2 = Curl_output_ntlm(conn,proxy);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      pcVar4 = "NTLM";
    }
LAB_00560146:
    pcVar6 = "Server";
    ppcVar8 = &conn->user;
    if (proxy) {
      pcVar6 = "Proxy";
      ppcVar8 = &(conn->http_proxy).user;
    }
    pcVar7 = "";
    if (*ppcVar8 != (char *)0x0) {
      pcVar7 = *ppcVar8;
    }
    Curl_infof(data,"%s auth using %s with user \'%s\'\n",pcVar6,pcVar4,pcVar7);
    authstatus->multipass = (_Bool)(authstatus->done ^ 1);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS) || defined(USE_SPNEGO)
  struct Curl_easy *data = conn->data;
#endif
#ifdef USE_SPNEGO
  struct negotiatedata *negdata = proxy ?
    &data->state.proxyneg : &data->state.negotiate;
#endif

#ifdef CURL_DISABLE_CRYPTO_AUTH
  (void)request;
  (void)path;
#endif

#ifdef USE_SPNEGO
  negdata->state = GSS_AUTHNONE;
  if((authstatus->picked == CURLAUTH_NEGOTIATE) &&
     negdata->context && !GSS_ERROR(negdata->status)) {
    auth = "Negotiate";
    result = Curl_output_negotiate(conn, proxy);
    if(result)
      return result;
    authstatus->done = TRUE;
    negdata->state = GSS_AUTHSENT;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth="NTLM_WB";
    result = Curl_output_ntlm_wb(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(conn,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if((proxy && conn->bits.proxy_user_passwd &&
        !Curl_checkProxyheaders(conn, "Proxy-authorization:")) ||
       (!proxy && conn->bits.user_passwd &&
        !Curl_checkheaders(conn, "Authorization:"))) {
      auth = "Basic";
      result = http_output_basic(conn, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }

  if(auth) {
    infof(data, "%s auth using %s with user '%s'\n",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (conn->http_proxy.user ? conn->http_proxy.user : "") :
                  (conn->user ? conn->user : ""));
    authstatus->multipass = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multipass = FALSE;

  return CURLE_OK;
}